

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O0

void __thiscall
ArgParser::add(ArgParser *this,float *var,string *name,string *shortName,string *description,
              bool optional)

{
  string local_188;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  ArgHolder arg;
  bool optional_local;
  string *description_local;
  string *shortName_local;
  string *name_local;
  float *var_local;
  ArgParser *this_local;
  
  arg.validSTRING.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = optional;
  std::__cxx11::string::string((string *)&local_138,(string *)name);
  std::__cxx11::string::string((string *)&local_158,(string *)shortName);
  std::__cxx11::string::string((string *)&local_188,(string *)description);
  ArgHolder::ArgHolder
            ((ArgHolder *)local_118,&local_138,&local_158,&local_188,
             (bool)(arg.validSTRING.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  arg.description.field_2._12_4_ = 3;
  arg.validUINT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)var;
  std::vector<ArgHolder,_std::allocator<ArgHolder>_>::push_back
            (&this->m_args,(value_type *)local_118);
  ArgHolder::~ArgHolder((ArgHolder *)local_118);
  return;
}

Assistant:

void ArgParser::add(float *var,
                    std::string name, std::string shortName, std::string description,
                    bool optional)
{
    ArgHolder arg(name, shortName, description, optional);
    arg.varFLOAT = var;
    arg.argType = ARG_FLOAT;
    m_args.push_back(arg);
}